

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O2

JavascriptString * __thiscall Js::BoundFunction::GetDisplayNameImpl(BoundFunction *this)

{
  RecyclableObject *instance;
  bool bVar1;
  JavascriptString *pJVar2;
  Var aValue;
  JavascriptString *pstLeft;
  
  pJVar2 = JavascriptLibrary::GetEmptyString
                     ((((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
                        type.ptr)->javascriptLibrary).ptr);
  instance = (this->targetFunction).ptr;
  if (instance != (RecyclableObject *)0x0) {
    aValue = JavascriptOperators::GetPropertyNoCache
                       (instance,0x106,
                        (((((instance->type).ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr);
    bVar1 = VarIs<Js::JavascriptString>(aValue);
    if (bVar1) {
      pJVar2 = VarTo<Js::JavascriptString>(aValue);
    }
  }
  pstLeft = StringCache::GetBoundFunctionPrefix
                      (&((((this->super_JavascriptFunction).super_DynamicObject.
                           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->stringCache);
  pJVar2 = JavascriptString::Concat(pstLeft,pJVar2);
  return pJVar2;
}

Assistant:

JavascriptString* BoundFunction::GetDisplayNameImpl() const
    {
        JavascriptString* displayName = GetLibrary()->GetEmptyString();
        if (targetFunction != nullptr)
        {
            Var value = JavascriptOperators::GetPropertyNoCache(targetFunction, PropertyIds::name, targetFunction->GetScriptContext());
            if (VarIs<JavascriptString>(value))
            {
                displayName = VarTo<JavascriptString>(value);
            }
        }
        return JavascriptString::Concat(GetLibrary()->GetBoundFunctionPrefixString(), displayName);
    }